

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# widget.cpp
# Opt level: O1

void __thiscall polyscope::Widget::Widget(Widget *this,void **vtt)

{
  _Atomic_word *p_Var1;
  _func_int **pp_Var2;
  int iVar3;
  WeakHandle<polyscope::Widget> WStack_28;
  
  pp_Var2 = (_func_int **)*vtt;
  this->_vptr_Widget = pp_Var2;
  *(void **)((long)&this->_vptr_Widget + (long)pp_Var2[-3]) = vtt[1];
  WeakReferrable::getWeakHandle<polyscope::Widget>
            (&WStack_28,(WeakReferrable *)((long)&this->_vptr_Widget + (long)this->_vptr_Widget[-3])
             ,this);
  std::
  vector<polyscope::WeakHandle<polyscope::Widget>,std::allocator<polyscope::WeakHandle<polyscope::Widget>>>
  ::emplace_back<polyscope::WeakHandle<polyscope::Widget>>
            ((vector<polyscope::WeakHandle<polyscope::Widget>,std::allocator<polyscope::WeakHandle<polyscope::Widget>>>
              *)&state::widgets,&WStack_28);
  if (WStack_28.super_GenericWeakHandle.sentinel.super___weak_ptr<int,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &(WStack_28.super_GenericWeakHandle.sentinel.
                 super___weak_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_weak_count
      ;
      iVar3 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar3 = (WStack_28.super_GenericWeakHandle.sentinel.
               super___weak_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_weak_count;
      (WStack_28.super_GenericWeakHandle.sentinel.super___weak_ptr<int,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_weak_count = iVar3 + -1;
    }
    if (iVar3 == 1) {
      (*(WStack_28.super_GenericWeakHandle.sentinel.
         super___weak_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _vptr__Sp_counted_base[3])();
    }
  }
  return;
}

Assistant:

Widget::Widget() { state::widgets.push_back(getWeakHandle<Widget>(this)); }